

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_frontend.cpp
# Opt level: O3

void __thiscall
basisu::basisu_frontend::compute_endpoint_clusters_within_each_parent_cluster(basisu_frontend *this)

{
  vector<basisu::vector<unsigned_int>_> *this_00;
  byte bVar1;
  uint uVar2;
  void *__ptr;
  uint *puVar3;
  uint uVar4;
  undefined8 in_RAX;
  long lVar5;
  uint *puVar6;
  uint *puVar7;
  char *__function;
  uint32_t new_size;
  uint uVar8;
  ulong uVar9;
  uint *puVar10;
  ulong uVar11;
  long lVar12;
  vector<unsigned_int> *pvVar13;
  uint32_t cluster_index;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  generate_block_endpoint_clusters(this);
  this_00 = &this->m_endpoint_clusters_within_each_parent_cluster;
  uVar11 = (ulong)(this->m_endpoint_clusters_within_each_parent_cluster).m_size;
  if (uVar11 != 0) {
    pvVar13 = this_00->m_p;
    lVar12 = 0;
    do {
      __ptr = *(void **)((long)&pvVar13->m_p + lVar12);
      if (__ptr != (void *)0x0) {
        free(__ptr);
      }
      lVar12 = lVar12 + 0x10;
    } while (uVar11 << 4 != lVar12);
    (this->m_endpoint_clusters_within_each_parent_cluster).m_size = 0;
  }
  uVar8 = (this->m_endpoint_parent_clusters).m_size;
  if (uVar8 != 0) {
    uVar4 = 0;
    if ((this->m_endpoint_clusters_within_each_parent_cluster).m_capacity < uVar8) {
      elemental_vector::increase_capacity
                ((elemental_vector *)this_00,uVar8,uVar8 == 1,0x10,(object_mover)0x0,false);
      uVar4 = (this->m_endpoint_clusters_within_each_parent_cluster).m_size;
    }
    if (uVar8 - uVar4 != 0) {
      memset(this_00->m_p + uVar4,0,(ulong)(uVar8 - uVar4) << 4);
    }
    (this->m_endpoint_clusters_within_each_parent_cluster).m_size = uVar8;
  }
  if (this->m_total_blocks != 0) {
    uVar11 = 0;
    do {
      if ((this->m_block_endpoint_clusters_indices).m_size <= uVar11) {
        __function = "T &basisu::vector<basisu::vec2U>::operator[](size_t) [T = basisu::vec2U]";
LAB_00231c5e:
        __assert_fail("i < m_size",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                      ,0x178,__function);
      }
      uVar8 = (this->m_block_endpoint_clusters_indices).m_p[uVar11].m_comps[0];
      uStack_38 = CONCAT44(uVar8,(undefined4)uStack_38);
      if ((this->m_block_parent_endpoint_cluster).m_size <= uVar11) {
        __function = "T &basisu::vector<unsigned char>::operator[](size_t) [T = unsigned char]";
        goto LAB_00231c5e;
      }
      bVar1 = (this->m_block_parent_endpoint_cluster).m_p[uVar11];
      if ((this->m_endpoint_clusters_within_each_parent_cluster).m_size <= (uint)bVar1) {
        __function = 
        "T &basisu::vector<basisu::vector<unsigned int>>::operator[](size_t) [T = basisu::vector<unsigned int>]"
        ;
        goto LAB_00231c5e;
      }
      pvVar13 = this_00->m_p;
      puVar7 = pvVar13[bVar1].m_p;
      uVar4 = pvVar13[bVar1].m_size;
      uVar9 = (ulong)uVar4;
      if ((uint *)((long)&uStack_38 + 4U) < puVar7 + uVar9 &&
          (puVar7 <= (uint *)((long)&uStack_38 + 4U) && puVar7 != (uint *)0x0)) {
        __assert_fail("!m_p || (&obj < m_p) || (&obj >= (m_p + m_size))",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                      ,0x267,
                      "void basisu::vector<unsigned int>::push_back(const T &) [T = unsigned int]");
      }
      pvVar13 = pvVar13 + bVar1;
      if (pvVar13->m_capacity <= uVar4) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)pvVar13,uVar4 + 1,true,4,(object_mover)0x0,false);
        puVar7 = pvVar13->m_p;
        uVar9 = (ulong)pvVar13->m_size;
        uVar8 = uStack_38._4_4_;
      }
      puVar7[uVar9] = uVar8;
      pvVar13->m_size = pvVar13->m_size + 1;
      uVar11 = uVar11 + 1;
    } while (uVar11 < this->m_total_blocks);
    uVar8 = (this->m_endpoint_clusters_within_each_parent_cluster).m_size;
  }
  if (uVar8 != 0) {
    uVar8 = 0;
    do {
      uVar4 = this_00->m_p[uVar8].m_size;
      uVar11 = (ulong)uVar4;
      if (uVar11 == 0) {
        error_printf("basisu_frontend: verify check failed at line %i!\n",0x402);
        abort();
      }
      pvVar13 = this_00->m_p + uVar8;
      puVar7 = pvVar13->m_p;
      lVar12 = 0x3f;
      if (uVar11 != 0) {
        for (; uVar4 >> lVar12 == 0; lVar12 = lVar12 + -1) {
        }
      }
      std::__introsort_loop<unsigned_int*,long,__gnu_cxx::__ops::_Iter_less_iter>
                (puVar7,puVar7 + uVar11,((uint)lVar12 ^ 0x3f) * 2 ^ 0x7e);
      std::__final_insertion_sort<unsigned_int*,__gnu_cxx::__ops::_Iter_less_iter>
                (puVar7,puVar7 + uVar11);
      puVar6 = pvVar13->m_p;
      uVar11 = (ulong)pvVar13->m_size;
      puVar7 = puVar6 + uVar11;
      if (uVar11 == 0) {
        uVar11 = 0;
      }
      else {
        lVar12 = uVar11 * 4 + -4;
        puVar3 = puVar6 + 1;
        do {
          puVar10 = puVar3;
          if (lVar12 == 0) goto LAB_00231bb9;
          lVar12 = lVar12 + -4;
          puVar3 = puVar10 + 1;
        } while (puVar10[-1] != *puVar10);
        puVar7 = puVar10 + -1;
        if (lVar12 != 0) {
          lVar5 = 0;
          uVar4 = puVar10[-1];
          do {
            uVar2 = *(uint *)((long)(puVar10 + 1) + lVar5);
            if (uVar4 != uVar2) {
              puVar7[1] = uVar2;
              puVar7 = puVar7 + 1;
            }
            lVar5 = lVar5 + 4;
            uVar4 = uVar2;
          } while (lVar12 != lVar5);
          puVar6 = pvVar13->m_p;
          uVar11 = (ulong)pvVar13->m_size;
        }
        puVar7 = puVar7 + 1;
      }
LAB_00231bb9:
      vector<unsigned_int>::erase(pvVar13,puVar7,puVar6 + uVar11);
      uVar8 = uVar8 + 1;
    } while (uVar8 < (this->m_endpoint_clusters_within_each_parent_cluster).m_size);
  }
  return;
}

Assistant:

void basisu_frontend::compute_endpoint_clusters_within_each_parent_cluster()
	{
		generate_block_endpoint_clusters();

		m_endpoint_clusters_within_each_parent_cluster.resize(0);
		m_endpoint_clusters_within_each_parent_cluster.resize(m_endpoint_parent_clusters.size());

		// Note: It's possible that some blocks got moved into the same cluster, but live in different parent clusters.
		for (uint32_t block_index = 0; block_index < m_total_blocks; block_index++)
		{
			const uint32_t cluster_index = m_block_endpoint_clusters_indices[block_index][0];
			const uint32_t parent_cluster_index = m_block_parent_endpoint_cluster[block_index];

			m_endpoint_clusters_within_each_parent_cluster[parent_cluster_index].push_back(cluster_index);
		}

		for (uint32_t i = 0; i < m_endpoint_clusters_within_each_parent_cluster.size(); i++)
		{
			uint_vec &cluster_indices = m_endpoint_clusters_within_each_parent_cluster[i];

			BASISU_FRONTEND_VERIFY(cluster_indices.size());

			vector_sort(cluster_indices);
			
			auto last = std::unique(cluster_indices.begin(), cluster_indices.end());
			cluster_indices.erase(last, cluster_indices.end());
		}
	}